

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O3

void ur_df2(double *y,int N,char *type,int *lags,char *selectlags,double *cval,int *cvrows,
           int *cvcols,double *cprobs,double *teststat,int *ltstat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double *oup;
  double *y_00;
  ulong uVar9;
  void *__src;
  double *pdVar10;
  void *__ptr;
  double *pdVar11;
  double *pdVar12;
  reg_object prVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  undefined *puVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  char *__s;
  undefined *puVar24;
  long lVar25;
  size_t sVar26;
  uint p;
  uint N_00;
  bool bVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  double dVar32;
  size_t local_48;
  reg_object local_40;
  ulong uVar27;
  
  if (lags == (int *)0x0) {
    uVar8 = 1;
  }
  else {
    uVar8 = (ulong)(uint)*lags;
    if (*lags < 0) {
      __s = "lags should be > 0. ";
      goto LAB_00148ef2;
    }
  }
  iVar7 = (int)uVar8;
  p = iVar7 + 1;
  uVar27 = (ulong)p;
  uVar19 = N - 1;
  iVar20 = uVar19 - p;
  lVar25 = (long)iVar20;
  lVar22 = lVar25 + 1;
  N_00 = iVar20 + 1;
  oup = (double *)malloc((long)N * 8 - 8);
  sVar26 = lVar25 * 8 + 8;
  y_00 = (double *)malloc(sVar26 * uVar27);
  diff(y,N,1,oup);
  uVar9 = 0;
  uVar17 = uVar8;
  pdVar10 = y_00;
  do {
    if (-1 < iVar20) {
      uVar23 = 0;
      do {
        pdVar10[uVar23] = oup[(int)uVar17 + (int)uVar23];
        uVar23 = uVar23 + 1;
      } while (N_00 != uVar23);
    }
    uVar9 = uVar9 + 1;
    pdVar10 = pdVar10 + lVar25 + 1;
    uVar17 = uVar17 - 1;
  } while (uVar9 != uVar27);
  __src = malloc(sVar26);
  pdVar10 = (double *)malloc(sVar26);
  if (iVar7 < (int)uVar19) {
    lVar25 = 0;
    do {
      *(double *)((long)__src + lVar25 * 8) = (double)(int)((int)lVar25 + p);
      lVar25 = lVar25 + 1;
    } while (uVar19 - uVar8 != lVar25);
  }
  pdVar16 = y + uVar8;
  iVar20 = (int)lVar22;
  if (uVar8 == 0) {
    pdVar11 = (double *)malloc(lVar22 * 0x10);
    iVar7 = strcmp(type,"none");
    if (iVar7 != 0) {
      iVar7 = strcmp(type,"drift");
      if (iVar7 == 0) {
        pdVar12 = (double *)malloc(0x20);
        local_40 = reg_init(N_00,2);
        setIntercept(local_40,1);
        memcpy(pdVar11,pdVar16,sVar26);
        regress(local_40,pdVar11,y_00,pdVar10,pdVar12,0.95);
        dVar31 = *(double *)(local_40 + 1);
        dVar1 = local_40[1].sigma_lower;
        dVar2 = local_40->RSS;
        iVar7 = local_40->df_RSS;
        prVar13 = reg_init(iVar20,0);
        regress(prVar13,(double *)0x0,y_00,pdVar10,pdVar12,0.95);
        dVar3 = prVar13->RSS;
        dVar4 = local_40->RSS;
        iVar20 = prVar13->df_RSS;
        iVar6 = local_40->df_RSS;
        *teststat = dVar31 / dVar1;
        teststat[1] = ((dVar3 - dVar4) / (double)(iVar20 - iVar6)) / (dVar2 / (double)iVar7);
        *ltstat = 2;
      }
      else {
        pdVar12 = (double *)malloc(0x48);
        local_40 = reg_init(N_00,3);
        setIntercept(local_40,1);
        memcpy(pdVar11,pdVar16,sVar26);
        memcpy(pdVar11 + lVar22,__src,sVar26);
        regress(local_40,pdVar11,y_00,pdVar10,pdVar12,0.95);
        dVar31 = *(double *)(local_40 + 1);
        dVar1 = local_40[1].sigma_lower;
        dVar32 = local_40->RSS / (double)local_40->df_RSS;
        prVar13 = reg_init(N_00,0);
        regress(prVar13,(double *)0x0,y_00,pdVar10,pdVar12,0.95);
        dVar2 = prVar13->RSS;
        dVar3 = local_40->RSS;
        iVar7 = prVar13->df_RSS;
        iVar6 = local_40->df_RSS;
        free(prVar13);
        prVar13 = reg_init(iVar20,1);
        setIntercept(prVar13,1);
        regress(prVar13,(double *)0x0,y_00,pdVar10,pdVar12,0.95);
        dVar4 = prVar13->RSS;
        dVar5 = local_40->RSS;
        iVar20 = prVar13->df_RSS;
        iVar21 = local_40->df_RSS;
        *teststat = dVar31 / dVar1;
        teststat[1] = ((dVar2 - dVar3) / (double)(iVar7 - iVar6)) / dVar32;
        teststat[2] = ((dVar4 - dVar5) / (double)(iVar20 - iVar21)) / dVar32;
        *ltstat = 3;
      }
      goto LAB_00148d15;
    }
    pdVar12 = (double *)malloc(8);
    local_40 = reg_init(iVar20,1);
    setIntercept(local_40,0);
    memcpy(pdVar11,pdVar16,sVar26);
    regress(local_40,pdVar11,y_00,pdVar10,pdVar12,0.95);
    *teststat = local_40->beta[0].value / local_40->beta[0].stdErr;
    *ltstat = 1;
  }
  else {
    iVar6 = strcmp(selectlags,"fixed");
    if (iVar6 != 0) {
      __ptr = malloc(uVar27 * 8);
      pdVar11 = (double *)malloc((iVar7 + 2) * sVar26);
      uVar17 = 0;
      do {
        *(undefined8 *)((long)__ptr + uVar17 * 8) = 0x7ff8000000000000;
        uVar17 = uVar17 + 1;
      } while (uVar27 != uVar17);
      lVar25 = 2;
      local_40 = (reg_object)0x10;
      local_48 = lVar22 * 8;
      do {
        memcpy(pdVar11,pdVar16,sVar26);
        iVar7 = strcmp(type,"none");
        if (iVar7 == 0) {
          pdVar12 = (double *)malloc((long)local_40 * lVar25);
          prVar13 = reg_init(N_00,(int)lVar25);
          iVar7 = 0;
LAB_001483b4:
          setIntercept(prVar13,iVar7);
          memcpy(pdVar11 + lVar22,y_00 + lVar22,local_48);
        }
        else {
          iVar7 = strcmp(type,"drift");
          if (iVar7 == 0) {
            pdVar12 = (double *)malloc(((long)local_40 + 8) * (lVar25 + 1));
            prVar13 = reg_init(iVar20,(int)(lVar25 + 1));
            iVar7 = 1;
            goto LAB_001483b4;
          }
          iVar7 = strcmp(type,"trend");
          if (iVar7 != 0) goto LAB_00148eeb;
          pdVar12 = (double *)malloc(((long)local_40 + 0x10) * (lVar25 + 2));
          prVar13 = reg_init(N_00,(int)(lVar25 + 2));
          setIntercept(prVar13,1);
          memcpy(pdVar11 + lVar22,__src,sVar26);
          memcpy(pdVar11 + iVar20 * 2,y_00 + lVar22,local_48);
        }
        regress(prVar13,pdVar11,y_00,pdVar10,pdVar12,0.95);
        iVar7 = strcmp(selectlags,"aic");
        if (iVar7 == 0) {
          lVar14 = 0x98;
LAB_00148434:
          *(undefined8 *)((long)__ptr + lVar25 * 8 + -8) =
               *(undefined8 *)((long)prVar13->R2 + lVar14 + -0x38);
        }
        else {
          iVar7 = strcmp(selectlags,"bic");
          if (iVar7 == 0) {
            lVar14 = 0xa0;
            goto LAB_00148434;
          }
        }
        free_reg(prVar13);
        local_40 = (reg_object)((long)local_40 + 8);
        local_48 = local_48 + lVar22 * 8;
        lVar14 = lVar25 - uVar8;
        lVar25 = lVar25 + 1;
      } while (lVar14 != 1);
      uVar9 = 0;
      uVar29 = 0xffffffff;
      uVar30 = 0x7fefffff;
      uVar17 = 1;
      do {
        dVar31 = *(double *)((long)__ptr + uVar17 * 8);
        if (dVar31 <= (double)CONCAT44(uVar30,uVar29) && (double)CONCAT44(uVar30,uVar29) != dVar31)
        {
          uVar9 = uVar17 & 0xffffffff;
        }
        if ((double)CONCAT44(uVar30,uVar29) <= dVar31) {
          dVar31 = (double)CONCAT44(uVar30,uVar29);
        }
        uVar29 = SUB84(dVar31,0);
        uVar30 = (undefined4)((ulong)dVar31 >> 0x20);
        bVar28 = uVar17 != uVar8;
        uVar17 = uVar17 + 1;
      } while (bVar28);
      p = (int)uVar9 + 1;
      free(__ptr);
      free(pdVar11);
      free(pdVar12);
    }
    lVar25 = (long)(int)(p + 1);
    pdVar11 = (double *)malloc(sVar26 * lVar25);
    memcpy(pdVar11,pdVar16,sVar26);
    iVar6 = p - 1;
    iVar21 = iVar6 * N_00;
    iVar7 = strcmp(type,"none");
    if (iVar7 == 0) {
      pdVar12 = (double *)malloc((long)(int)p * (long)(int)p * 8);
      local_40 = reg_init(iVar20,p);
      setIntercept(local_40,0);
      memcpy(pdVar11 + lVar22,y_00 + lVar22,(long)iVar21 << 3);
      regress(local_40,pdVar11,y_00,pdVar10,pdVar12,0.95);
      *teststat = local_40->beta[0].value / local_40->beta[0].stdErr;
      *ltstat = 1;
    }
    else {
      iVar7 = strcmp(type,"drift");
      if (iVar7 == 0) {
        pdVar12 = (double *)malloc(lVar25 * lVar25 * 8);
        local_40 = reg_init(N_00,p + 1);
        setIntercept(local_40,1);
        memcpy(pdVar11 + lVar22,y_00 + lVar22,(long)iVar21 << 3);
        regress(local_40,pdVar11,y_00,pdVar10,pdVar12,0.95);
        dVar31 = *(double *)(local_40 + 1);
        dVar1 = local_40[1].sigma_lower;
        iVar7 = local_40->df_RSS;
        dVar2 = local_40->RSS;
        pdVar16 = (double *)malloc(sVar26 * (long)iVar6);
        memcpy(pdVar16,y_00 + lVar22,sVar26 * (long)iVar6);
        prVar13 = reg_init(iVar20,iVar6);
        setIntercept(prVar13,0);
        regress(prVar13,pdVar16,y_00,pdVar10,pdVar12,0.95);
        dVar3 = prVar13->RSS;
        dVar4 = local_40->RSS;
        iVar20 = prVar13->df_RSS;
        iVar6 = local_40->df_RSS;
        *teststat = dVar31 / dVar1;
        teststat[1] = ((dVar3 - dVar4) / (double)(iVar20 - iVar6)) / (dVar2 / (double)iVar7);
        *ltstat = 2;
        free(pdVar16);
      }
      else {
        iVar7 = strcmp(type,"trend");
        if (iVar7 != 0) {
LAB_00148eeb:
          __s = "type only accepts one of three values - none, drift and trend ";
LAB_00148ef2:
          puts(__s);
          exit(-1);
        }
        iVar7 = p + 2;
        pdVar12 = (double *)malloc((long)iVar7 * (long)iVar7 * 8);
        local_40 = reg_init(N_00,iVar7);
        setIntercept(local_40,1);
        memcpy(pdVar11 + lVar22,__src,sVar26);
        pdVar16 = y_00 + lVar22;
        memcpy(pdVar11 + iVar20 * 2,pdVar16,(long)iVar21 << 3);
        regress(local_40,pdVar11,y_00,pdVar10,pdVar12,0.95);
        dVar31 = *(double *)(local_40 + 1);
        dVar1 = local_40[1].sigma_lower;
        dVar32 = local_40->RSS / (double)local_40->df_RSS;
        sVar26 = sVar26 * (long)iVar6;
        pdVar15 = (double *)malloc(sVar26);
        memcpy(pdVar15,pdVar16,sVar26);
        prVar13 = reg_init(iVar20,iVar6);
        setIntercept(prVar13,0);
        regress(prVar13,pdVar15,y_00,pdVar10,pdVar12,0.95);
        dVar2 = prVar13->RSS;
        dVar3 = local_40->RSS;
        iVar7 = prVar13->df_RSS;
        iVar20 = local_40->df_RSS;
        free(pdVar15);
        free(prVar13);
        pdVar15 = (double *)malloc(sVar26);
        memcpy(pdVar15,pdVar16,sVar26);
        prVar13 = reg_init(N_00,p);
        setIntercept(prVar13,1);
        regress(prVar13,pdVar15,y_00,pdVar10,pdVar12,0.95);
        dVar4 = prVar13->RSS;
        dVar5 = local_40->RSS;
        iVar6 = prVar13->df_RSS;
        iVar21 = local_40->df_RSS;
        *teststat = dVar31 / dVar1;
        teststat[1] = ((dVar2 - dVar3) / (double)(iVar7 - iVar20)) / dVar32;
        teststat[2] = ((dVar4 - dVar5) / (double)(iVar6 - iVar21)) / dVar32;
        *ltstat = 3;
        free(pdVar15);
      }
LAB_00148d15:
      free(prVar13);
    }
  }
  free(pdVar11);
  free(pdVar12);
  if (N < 0x1a) {
    lVar22 = 0;
  }
  else {
    lVar22 = 3;
    if (((0x32 < (uint)N) && (lVar22 = 6, 100 < (uint)N)) && (lVar22 = 9, 0xfa < (uint)N)) {
      lVar22 = (ulong)(500 < (uint)N) * 3 + 0xc;
    }
  }
  iVar7 = strcmp(type,"none");
  if (iVar7 == 0) {
    iVar7 = 1;
    puVar18 = &DAT_00155dc0;
  }
  else {
    iVar7 = strcmp(type,"drift");
    if (iVar7 == 0) {
      iVar7 = 2;
      puVar18 = &DAT_00155f70;
      lVar25 = 0x18;
      puVar24 = &DAT_00155e50;
      pdVar16 = cval;
    }
    else {
      iVar7 = strcmp(type,"trend");
      if (iVar7 != 0) goto LAB_00148e82;
      cval[2] = (double)(&DAT_00155ef0)[lVar22];
      dVar31 = *(double *)(&UNK_00155ee8 + lVar22 * 8);
      *cval = *(double *)(&DAT_00155ee0 + lVar22 * 8);
      cval[1] = dVar31;
      iVar7 = 3;
      puVar18 = &DAT_00156090;
      lVar25 = 0x30;
      puVar24 = &DAT_00156000;
      pdVar16 = cval + 3;
    }
    pdVar16[2] = *(double *)(puVar24 + lVar22 * 8 + 0x10);
    dVar31 = *(double *)((long)(puVar24 + lVar22 * 8) + 8);
    *pdVar16 = *(double *)(puVar24 + lVar22 * 8);
    pdVar16[1] = dVar31;
    cval = (double *)((long)cval + lVar25);
  }
  cval[2] = *(double *)(puVar18 + lVar22 * 8 + 0x10);
  dVar31 = *(double *)((long)(puVar18 + lVar22 * 8) + 8);
  *cval = *(double *)(puVar18 + lVar22 * 8);
  cval[1] = dVar31;
  *cvrows = iVar7;
  *cvcols = 3;
LAB_00148e82:
  *cprobs = 0.01;
  cprobs[1] = 0.05;
  cprobs[2] = 0.1;
  free(y_00);
  free(oup);
  free(__src);
  free(pdVar10);
  free(local_40);
  return;
}

Assistant:

void ur_df2(double *y, int N,const char* type, int *lags,const char *selectlags,double *cval,int *cvrows, int *cvcols, double *cprobs, double *teststat,int *ltstat) {
    int lags_, lag, N1, N2,i,j,iter,p,ltmp,p1,p2,p3,rowselec,row1;
    double *z, *x,*z_diff,*z_lag_1,*tt,*critRes,*z_diff_lag,*XX,*varcovar,*res,*XX2,*XX3;
    reg_object fit, phi1_fit,phi2_fit,phi3_fit;
    double alpha = 0.95;
    double ctemp,tau,scale,sos,dfs,phi1,phi2,phi3;
    double cval_tau1[18] = {-2.66, -1.95, -1.60,-2.62, -1.95, -1.61,-2.60, -1.95, -1.61,-2.58, -1.95, -1.62,
        -2.58, -1.95, -1.62,-2.58, -1.95, -1.62};
    double cval_tau2[18] = {-3.75, -3.00, -2.63,-3.58, -2.93, -2.60,-3.51, -2.89, -2.58,-3.46, -2.88, -2.57,
        -3.44, -2.87, -2.57,-3.43, -2.86, -2.57};
    double cval_tau3[18] = {-4.38, -3.60, -3.24,-4.15, -3.50, -3.18,-4.04, -3.45, -3.15,-3.99, -3.43, -3.13,
        -3.98, -3.42, -3.13,-3.96, -3.41, -3.12};
    double cval_phi1[18] = {7.88, 5.18, 4.12,7.06, 4.86, 3.94,6.70, 4.71, 3.86,6.52, 4.63, 3.81,6.47, 4.61,
         3.79,6.43, 4.59, 3.78};
    double cval_phi2[18] = {8.21, 5.68, 4.67,7.02, 5.13, 4.31,6.50, 4.88, 4.16,6.22, 4.75, 4.07,6.15, 4.71,
         4.05,6.09, 4.68, 4.03};
    double cval_phi3[18] = {10.61, 7.24, 5.91,9.31, 6.73, 5.61,8.73, 6.49, 5.47,8.43, 6.49, 5.47,8.34, 6.30,
         5.36,8.27, 6.25, 5.34};

    lags_ = (lags == NULL) ? 1 : *lags;
    lag = lags_;

    if (lag < 0) {
        printf("lags should be > 0. \n");
        exit(-1);
    }

    lags_+=1;

    N1 = N - 1;
    N2 = N1 - lags_ + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*N2*lags_);
    

    diff(y,N,1,z);// z = y(t) - y(t-1)
    
    for(i = 0; i < lags_;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags_+j-i-1];
        }
    } 


    z_diff = &x[0];//length N2
    z_lag_1 = &y[lags_-1];//length N2


    tt = (double*)malloc(sizeof(double)*N2);
    res = (double*)malloc(sizeof(double)*N2);

    for(i = lags_ - 1; i < N1;++i) {
        tt[i - lags_ +1] = i+1;
    }

    if (lags_ > 1) {
        if (strcmp(selectlags,"fixed")) {
            critRes = (double*) malloc(sizeof(double)*lags_);
            XX = (double*)malloc(sizeof(double)*N2*(lags_+1));
            for(i = 0; i < lags_;++i) {
                critRes[i] = NAN;
            }

            for(i = 1; i < lags_;++i) {
                iter = i * N2;

                memcpy(XX,z_lag_1,sizeof(double)*N2);

                if (!strcmp(type,"none")) {
                    p = 1 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,0);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);
                    
                } else if (!strcmp(type,"drift")) {
                    p = 2 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else if (!strcmp(type,"trend")) {
                    p = 3 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,tt,sizeof(double)*N2);
                    memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else {
                    printf("type only accepts one of three values - none, drift and trend \n");
                    exit(-1);
                }

                if (!strcmp(selectlags,"aic")) {
                    critRes[i] = fit->aic;
                } else if (!strcmp(selectlags,"bic")) {
                    critRes[i] = fit->bic;
                }

                free_reg(fit);
            }

            ctemp = DBL_MAX;
            ltmp = 0;

            for(i = 1; i < lags_;++i) {
                if (critRes[i] < ctemp) {
                    ctemp = critRes[i];
                    ltmp = i;
                }
            }

            lags_ = ltmp+1;


            free(critRes);
            free(XX);
            free(varcovar);
        }

        XX = (double*)malloc(sizeof(double)*N2*(lags_+1));

        memcpy(XX,z_lag_1,sizeof(double)*N2);
        iter = (lags_-1) * N2;

        if (!strcmp(type,"none")) {
            p = lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 1 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p1 = lags_ - 1;
            phi1_fit = reg_init(N2,p1);
            setIntercept(phi1_fit,0);
            regress(phi1_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;


            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(XX2);
            free(phi1_fit);
        } else if (!strcmp(type,"trend")) {
            p = 2 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p2 = lags_ - 1;
            phi2_fit = reg_init(N2,p2);
            setIntercept(phi2_fit,0);
            regress(phi2_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;


            free(XX2);
            free(phi2_fit);

            XX3 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX3,x+N2,sizeof(double)*N2*(lags_-1));
            p3 = lags_;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,XX3,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(XX3);
            free(phi3_fit);
        } else {
            printf("type only accepts one of three values - none, drift and trend \n");
            exit(-1);
        }

        free(XX);
        free(varcovar);

    } else {
        XX = (double*)malloc(sizeof(double)*2*N2);
        if (!strcmp(type,"none")) {
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p1 = 0;
            phi1_fit = reg_init(N2,p1);
            regress(phi1_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(phi1_fit);

        } else if (!strcmp(type,"trend")) {
            p = 3;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p2 = 0;
            phi2_fit = reg_init(N2,p2);
            regress(phi2_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;

            free(phi2_fit);

            p3 = 1;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(phi3_fit);
        }

        free(XX);
        free(varcovar);
    }

    
    if (N1 < 25){
        rowselec = 1;
    } else if (N1 < 50) {
        rowselec = 2;
    } else if (N1 < 100) {
        rowselec = 3;
    } else if (N1 < 250) {
        rowselec = 4;
    } else if (N1 < 500) {
        rowselec = 5;
    } else {
        rowselec = 6;
    }
    row1 = rowselec - 1;

    if (!strcmp(type,"none")) {
        memcpy(cval,cval_tau1+row1*3,sizeof(double)*3);
        *cvrows = 1;
        *cvcols = 3;
    } else if (!strcmp(type,"drift")) {
        memcpy(cval,cval_tau2+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi1+row1*3,sizeof(double)*3);
        *cvrows = 2;
        *cvcols = 3;
    } else if (!strcmp(type,"trend")) {
        memcpy(cval,cval_tau3+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi2+row1*3,sizeof(double)*3);
        memcpy(cval+6,cval_phi3+row1*3,sizeof(double)*3);
        *cvrows = 3;
        *cvcols = 3;
    }


    cprobs[0] = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;

    free(x);
    free(z);
    free(tt);
    free(res);
    free(fit);
}